

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coulombic_energy_compute.cpp
# Opt level: O2

void __thiscall
CoulombicEnergyCompute::particle_cluster_interact
          (CoulombicEnergyCompute *this,array<unsigned_long,_2UL> target_node_idxs,
          size_t source_node_idx)

{
  uint uVar1;
  int iVar2;
  Molecule *pMVar3;
  InterpolationPoints *pIVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer pdVar12;
  double *pdVar13;
  int k3;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int k1;
  ulong uVar19;
  pointer pdVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  
  uVar17 = target_node_idxs._M_elems[0];
  pMVar3 = this->molecule_;
  pIVar4 = this->mol_interp_pts_;
  pdVar5 = (pMVar3->super_Particles).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (pMVar3->super_Particles).y_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pMVar3->super_Particles).z_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (pMVar3->charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = this->num_mol_interp_pts_per_node_;
  lVar21 = (long)(int)uVar1 * source_node_idx;
  iVar2 = this->num_mol_interp_charges_per_node_;
  pdVar9 = (pIVar4->interp_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar10 = (pIVar4->interp_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar11 = (pIVar4->interp_z_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar16 = 0;
  if (0 < (int)uVar1) {
    uVar16 = (ulong)uVar1;
  }
  pdVar12 = (this->mol_interp_charge_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13 = (this->coul_eng_vec_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (; uVar17 < target_node_idxs._M_elems[1]; uVar17 = uVar17 + 1) {
    dVar22 = 0.0;
    iVar18 = 0;
    for (uVar19 = 0; uVar19 != uVar16; uVar19 = uVar19 + 1) {
      pdVar20 = pdVar12 + (long)iVar2 * source_node_idx + (long)iVar18;
      for (uVar15 = 0; uVar15 != uVar1; uVar15 = uVar15 + 1) {
        for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
          dVar23 = pdVar5[uVar17] - pdVar9[lVar21 + uVar19];
          dVar24 = pdVar6[uVar17] - pdVar10[lVar21 + uVar15];
          dVar25 = pdVar7[uVar17] - pdVar11[lVar21 + uVar14];
          dVar22 = dVar22 + (pdVar20[uVar14] / this->eps_solute_) /
                            SQRT(dVar25 * dVar25 + dVar23 * dVar23 + dVar24 * dVar24);
        }
        pdVar20 = pdVar20 + (int)uVar1;
      }
      iVar18 = iVar18 + uVar1 * uVar1;
    }
    *pdVar13 = pdVar8[uVar17] * dVar22 + *pdVar13;
  }
  return;
}

Assistant:

void CoulombicEnergyCompute::particle_cluster_interact(std::array<std::size_t, 2> target_node_idxs,
                                                       std::size_t source_node_idx)
{
//    timers_.particle_cluster_interact.start();
    
    /* Targets */
    
    std::size_t target_node_begin          = target_node_idxs[0];
    std::size_t target_node_end            = target_node_idxs[1];
    
    const double* __restrict mol_x_ptr = molecule_.x_ptr();
    const double* __restrict mol_y_ptr = molecule_.y_ptr();
    const double* __restrict mol_z_ptr = molecule_.z_ptr();

    const double* __restrict mol_q_ptr = molecule_.charge_ptr();

    /* Sources */
    
    int num_mol_interp_pts_per_node                 = num_mol_interp_pts_per_node_;
    int num_mol_interp_charges_per_node             = num_mol_interp_charges_per_node_;

    std::size_t source_cluster_interp_pts_begin     = source_node_idx * num_mol_interp_pts_per_node_;
    std::size_t source_cluster_interp_charges_begin = source_node_idx * num_mol_interp_charges_per_node_;
    
    const double* __restrict mol_clusters_x_ptr     = mol_interp_pts_.interp_x_ptr();
    const double* __restrict mol_clusters_y_ptr     = mol_interp_pts_.interp_y_ptr();
    const double* __restrict mol_clusters_z_ptr     = mol_interp_pts_.interp_z_ptr();
    
    const double* __restrict mol_clusters_q_ptr     = mol_interp_charge_.data();

    /* Potential */

    double* __restrict coul_eng_ptr = coul_eng_vec_.data();
    
    
#ifdef OPENACC_ENABLED
    int stream_id = std::rand() % 3;
    #pragma acc parallel loop async(stream_id) present(mol_x_ptr, mol_y_ptr, mol_z_ptr, mol_q_ptr, \
                                      mol_clusters_x_ptr, mol_clusters_y_ptr, mol_clusters_z_ptr, \
                                      mol_clusters_q_ptr, coul_eng_ptr)
#endif
    for (std::size_t j = target_node_begin; j < target_node_end; ++j) {

        double target_x = mol_x_ptr[j];
        double target_y = mol_y_ptr[j];
        double target_z = mol_z_ptr[j];
        double target_q = mol_q_ptr[j];
        
        double pot_temp = 0.;
        
#ifdef OPENACC_ENABLED
        #pragma acc loop collapse(3) reduction(+:pot_temp)
#endif
        for (int k1 = 0; k1 < num_mol_interp_pts_per_node; ++k1) {
        for (int k2 = 0; k2 < num_mol_interp_pts_per_node; ++k2) {
        for (int k3 = 0; k3 < num_mol_interp_pts_per_node; ++k3) {
                
            std::size_t kk = source_cluster_interp_charges_begin
                           + k1 * num_mol_interp_pts_per_node * num_mol_interp_pts_per_node
                           + k2 * num_mol_interp_pts_per_node + k3;

            double dx = target_x - mol_clusters_x_ptr[source_cluster_interp_pts_begin + k1];
            double dy = target_y - mol_clusters_y_ptr[source_cluster_interp_pts_begin + k2];
            double dz = target_z - mol_clusters_z_ptr[source_cluster_interp_pts_begin + k3];

            pot_temp += mol_clusters_q_ptr[kk] / eps_solute_ / std::sqrt(dx*dx + dy*dy + dz*dz);
        }
        }
        }
        
        pot_temp *= target_q;

#ifdef OPENACC_ENABLED
        #pragma acc atomic update
#elif  OPENMP_ENABLED
        #pragma omp atomic update
#endif
        coul_eng_ptr[0] += pot_temp;
    }

//    timers_.particle_cluster_interact.stop();
}